

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::clear
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this)

{
  CSkin *pCVar1;
  CSkin *in_RDI;
  
  allocator_default<CSkins::CSkin>::free_array(in_RDI);
  in_RDI->m_aName[4] = '\x01';
  in_RDI->m_aName[5] = '\0';
  in_RDI->m_aName[6] = '\0';
  in_RDI->m_aName[7] = '\0';
  pCVar1 = allocator_default<CSkins::CSkin>::alloc_array(0);
  *(CSkin **)in_RDI = pCVar1;
  in_RDI->m_aName[8] = '\0';
  in_RDI->m_aName[9] = '\0';
  in_RDI->m_aName[10] = '\0';
  in_RDI->m_aName[0xb] = '\0';
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}